

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::iLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  void *pvVar4;
  ulong uVar5;
  reference pvVar6;
  long lVar7;
  reference ppSVar8;
  ostream *this_00;
  byte in_DL;
  pair<int,_int> in_RSI;
  long in_RDI;
  pair<int,_int> in_XMM0_Qa;
  double dVar9;
  int best_n;
  int j;
  int i;
  bool completed;
  bool best_improvement;
  bool improvement;
  pair<int,_int> tabu;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> a_list;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double aux_eval;
  double current_eval;
  double local_best_eval;
  double used_time;
  clock_t time_begin;
  clock_t time_end;
  iterator s;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffc78;
  Station *pSVar10;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffc80;
  Station *in_stack_fffffffffffffc88;
  Plan *in_stack_fffffffffffffc90;
  Station *in_stack_fffffffffffffc98;
  Plan *in_stack_fffffffffffffca0;
  Station *in_stack_fffffffffffffcb0;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffcb8;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffcc0;
  double in_stack_fffffffffffffd08;
  void *in_stack_fffffffffffffd10;
  Station *in_stack_fffffffffffffd18;
  ostream *in_stack_fffffffffffffd28;
  Plan *in_stack_fffffffffffffd30;
  Station *in_stack_fffffffffffffd38;
  Station *in_stack_fffffffffffffd98;
  Plan local_1a0;
  undefined4 local_d0;
  pair<int,_int> local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  byte local_b7;
  byte local_b6;
  byte local_b5;
  pair<int,_int> local_a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_a0;
  undefined1 local_88 [32];
  Station *local_68;
  Station *local_60;
  _Base_ptr local_58;
  size_t local_50;
  clock_t local_48;
  _List_iterator<imrt::Station_*> local_40 [4];
  byte local_19;
  pair<int,_int> local_18;
  pair<int,_int> local_10;
  
  local_19 = in_DL & 1;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  Plan::get_stations_abi_cxx11_((Plan *)in_RSI);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::_List_iterator<imrt::Station_*>::_List_iterator(local_40);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x162c62);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x162c6f);
  std::pair<int,_int>::pair<int,_int,_true>(&local_a8);
  local_b5 = 1;
  local_b6 = *(int *)(in_RDI + 0x34) != 0;
  local_b7 = 0;
  local_d0 = 0xffffffff;
  local_1a0.evaluation_fx._4_4_ = 0xffffffff;
  local_cc = std::make_pair<int,int>((int *)in_stack_fffffffffffffc78,(int *)0x162cce);
  std::pair<int,_int>::operator=(&local_a8,&local_cc);
  local_c4 = -1;
  local_c0 = -1;
  local_88._24_8_ = Plan::getEvaluation((Plan *)local_10);
  local_68 = (Station *)local_88._24_8_;
  local_60 = (Station *)local_88._24_8_;
  if ((local_19 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Staring intensity local search...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_50 = clock();
  do {
    if ((local_b5 & 1) == 0) break;
    local_b5 = 0;
    local_b7 = 0;
    local_c0 = local_c0 + 1;
    local_68 = local_60;
    getShuffledIntensityNeighbors
              ((ApertureILS *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc90,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc88);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc90);
    if ((local_19 & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  iLS Neighborhood ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c0);
      poVar2 = std::operator<<(poVar2," size ");
      sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
      poVar2 = std::operator<<(poVar2,"    current ");
      pvVar4 = (void *)std::ostream::operator<<(poVar2,(double)local_60);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    for (local_bc = 0; uVar5 = (ulong)local_bc,
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_a0), uVar5 < sVar3; local_bc = local_bc + 1) {
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&local_a0,(long)local_bc);
      if ((pvVar6->first == local_a8.first) &&
         (pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](&local_a0,(long)local_bc), pvVar6->second == local_a8.second)) {
        lVar7 = (long)local_bc;
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_a0);
        if (lVar7 == sVar3 - 1) {
          local_b7 = 1;
        }
      }
      else {
        local_1a0.Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                                (in_stack_fffffffffffffc78);
        local_40[0]._M_node =
             (_List_node_base *)
             local_1a0.Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (&local_a0,(long)local_bc);
        std::advance<std::_List_iterator<imrt::Station*>,int>
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffca0,
                   (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
        if ((local_19 & 1) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"  iLS Neighbor ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_bc);
          poVar2 = std::operator<<(poVar2," over station ");
          ppSVar8 = std::_List_iterator<imrt::Station_*>::operator*
                              ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          iVar1 = Station::getAngle(*ppSVar8);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
          poVar2 = std::operator<<(poVar2," aperture ");
          pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](&local_a0,(long)local_bc);
          iVar1 = pvVar6->second;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          std::ostream::operator<<(poVar2,iVar1 + -1);
        }
        local_88._24_8_ = local_68;
        pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&local_a0,(long)local_bc);
        if (pvVar6->second < 0) {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (&local_a0,(long)local_bc);
          Station::getModifyIntensityApertureDiff_abi_cxx11_
                    (in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                     in_stack_fffffffffffffd08);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffc90,
                    (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffc88);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x163200);
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          dVar9 = Plan::get_delta_eval
                            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)in_stack_fffffffffffffc90,
                             (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          if (dVar9 <= (double)local_68) {
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                      (&local_a0,(long)local_bc);
            Station::modifyIntensityAperture_abi_cxx11_
                      (in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                       (double)in_stack_fffffffffffffd28);
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_fffffffffffffc90,
                      (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_fffffffffffffc88);
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1632fb
                 );
            sVar3 = std::__cxx11::
                    list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                              (in_stack_fffffffffffffc80);
            if (sVar3 != 0) {
              std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
              in_stack_fffffffffffffd98 =
                   (Station *)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                              in_stack_fffffffffffffc80);
              local_88._24_8_ = in_stack_fffffffffffffd98;
            }
          }
          else {
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
            Station::clearHistory(in_stack_fffffffffffffcb0);
          }
          if ((local_19 & 1) != 0) {
            poVar2 = std::operator<<((ostream *)&std::cout," (-");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x30));
            std::operator<<(poVar2,")");
          }
        }
        else {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (&local_a0,(long)local_bc);
          Station::getModifyIntensityApertureDiff_abi_cxx11_
                    (in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                     in_stack_fffffffffffffd08);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffc90,
                    (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffc88);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x163453);
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          dVar9 = Plan::get_delta_eval
                            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)in_stack_fffffffffffffc90,
                             (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          if (dVar9 <= (double)local_68) {
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                      (&local_a0,(long)local_bc);
            Station::modifyIntensityAperture_abi_cxx11_
                      (in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                       (double)in_stack_fffffffffffffd28);
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_fffffffffffffc90,
                      (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_fffffffffffffc88);
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x163543
                 );
            sVar3 = std::__cxx11::
                    list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                              (in_stack_fffffffffffffc80);
            if (sVar3 != 0) {
              std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
              local_88._24_8_ =
                   Plan::incremental_eval
                             (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                              in_stack_fffffffffffffc80);
            }
          }
          else {
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
            Station::clearHistory(in_stack_fffffffffffffcb0);
          }
          if ((local_19 & 1) != 0) {
            in_stack_fffffffffffffd38 = (Station *)std::operator<<((ostream *)&std::cout," (+");
            in_stack_fffffffffffffd30 =
                 (Plan *)std::ostream::operator<<(in_stack_fffffffffffffd38,*(int *)(in_RDI + 0x30))
            ;
            std::operator<<((ostream *)in_stack_fffffffffffffd30,")");
          }
        }
        if ((local_19 & 1) != 0) {
          in_stack_fffffffffffffd28 = std::operator<<((ostream *)&std::cout," result ");
          pvVar4 = (void *)std::ostream::operator<<
                                     (in_stack_fffffffffffffd28,(double)local_88._24_8_);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        }
        if (1e-05 < (double)local_60 - (double)local_88._24_8_) {
          local_60 = (Station *)local_88._24_8_;
          local_c4 = local_bc;
          local_b5 = 1;
          if ((local_19 & 1) != 0) {
            in_stack_fffffffffffffd18 =
                 (Station *)std::operator<<((ostream *)&std::cout,"     improvement ");
            in_stack_fffffffffffffd10 =
                 (void *)std::ostream::operator<<(in_stack_fffffffffffffd18,(double)local_88._24_8_)
            ;
            std::ostream::operator<<
                      (in_stack_fffffffffffffd10,std::endl<char,std::char_traits<char>>);
          }
          pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](&local_a0,(long)local_bc);
          local_a8.first = pvVar6->first;
          pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](&local_a0,(long)local_bc);
          local_a8.second = -pvVar6->second;
          if ((local_b6 & 1) == 0) {
            in_stack_fffffffffffffd08 = (double)(long)local_bc;
            sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              (&local_a0);
            if (in_stack_fffffffffffffd08 == (double)(sVar3 - 1)) {
              local_b7 = 1;
            }
            break;
          }
        }
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
        Station::undoLast_abi_cxx11_(in_stack_fffffffffffffd98);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc90,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc88);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x1637e3);
        sVar3 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ::size(in_stack_fffffffffffffc80);
        if (sVar3 != 0) {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
          local_88._24_8_ =
               Plan::incremental_eval
                         (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                          in_stack_fffffffffffffc80);
        }
        lVar7 = (long)local_bc;
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_a0);
        if (lVar7 == sVar3 - 1) {
          local_b7 = 1;
        }
        local_48 = clock();
        local_58 = (_Base_ptr)((double)(long)(local_48 - local_50) / 1000000.0);
        if ((((double)local_18 != 0.0) || (NAN((double)local_18))) &&
           ((double)local_18 <= (double)local_58)) break;
      }
    }
    if (((local_b5 & 1) != 0) && ((local_b6 & 1) != 0)) {
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&local_a0,(long)local_c4);
      if (pvVar6->second < 0) {
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (&local_a0,(long)local_c4);
        Station::modifyIntensityAperture_abi_cxx11_
                  (in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   (double)in_stack_fffffffffffffd28);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc90,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc88);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x1639b8);
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
        local_88._24_8_ =
             Plan::incremental_eval
                       (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                        in_stack_fffffffffffffc80);
      }
      else {
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (&local_a0,(long)local_c4);
        Station::modifyIntensityAperture_abi_cxx11_
                  (in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   (double)in_stack_fffffffffffffd28);
        in_stack_fffffffffffffcb0 = (Station *)local_88;
        in_stack_fffffffffffffca0 = &local_1a0;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc90,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffc88);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x163a7c);
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffc80);
        local_88._24_8_ =
             Plan::incremental_eval
                       (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                        in_stack_fffffffffffffc80);
      }
    }
    local_48 = clock();
    local_58 = (_Base_ptr)((double)(long)(local_48 - local_50) / 1000000.0);
  } while ((((double)local_18 == 0.0) && (!NAN((double)local_18))) ||
          ((double)local_58 < (double)local_18));
  poVar2 = std::operator<<((ostream *)&std::cout,"  iLS best: ");
  std::ostream::operator<<(poVar2,(double)local_60);
  if ((local_b7 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,": [nolo] : ");
  }
  else {
    std::operator<<((ostream *)&std::cout,": [lo] : ");
  }
  local_48 = clock();
  local_58 = (_Base_ptr)((double)(long)(local_48 - local_50) / 1000000.0);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(double)local_18);
  this_00 = std::operator<<(poVar2," :");
  pvVar4 = (void *)std::ostream::operator<<(this_00,(double)local_58);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  pSVar10 = local_60;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)poVar2);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x163c53);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x163c60);
  return (double)pSVar10;
}

Assistant:

double ApertureILS::iLocalSearch (Plan& P,  double max_time, bool verbose) {
    list<Station*> stations = P.get_stations();
    list<Station*>::iterator s;
    
    std::clock_t time_end, time_begin;
    double used_time; 
    
    double local_best_eval, current_eval, aux_eval;
    list<pair<int, double> > diff;
    vector<pair<int, int>> a_list;
    pair <int,int> tabu;
    
    bool improvement = true;
    bool best_improvement=ls_type;
    bool completed = false;
    int i, j, best_n;
    
    tabu = make_pair(-1,-1);
    best_n = -1;
    j=-1;
    local_best_eval = current_eval = aux_eval = P.getEvaluation();
    
    if (verbose)
      cout << "Staring intensity local search..." << endl;
    time_begin=clock();
    
    // Main local search loop
    while (improvement) {
      improvement = false;
      completed = false;
      j++;
      current_eval = local_best_eval;
      a_list = getShuffledIntensityNeighbors(P);

      if (verbose) {
        cout << "  iLS Neighborhood "<< j << " size "<< a_list.size() << "    current " << local_best_eval << endl;
      }
      
      // Check all the neighbors
      for (i = 0; i < a_list.size(); i++) {
         //skip the tabu neighbor (returns the station to previous state)
         if (a_list[i].first == tabu.first && a_list[i].second == tabu.second) {
           if (i == (a_list.size()-1)) completed = true;
           continue;
         }
         //get the station of the movement
         s = stations.begin();
         std::advance(s, a_list[i].first);
         
         if (verbose)
             cout << "  iLS Neighbor " << i << " over station " << (*s)->getAngle() << " aperture " <<  abs(a_list[i].second)-1;
         
         aux_eval = current_eval;
         
         //apply step_size intensity change (-(a+1) or +(a+1))
         if (a_list[i].second < 0 ){
           diff = (*s)->getModifyIntensityApertureDiff(abs(a_list[i].second)-1, -step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(abs(a_list[i].second)-1, -step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (-" << step_intensity << ")";
         } else {
           diff = (*s)->getModifyIntensityApertureDiff(a_list[i].second-1, step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(a_list[i].second-1, step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (+"<< step_intensity << ")";
         }
         
         if (verbose )
             cout << " result " << aux_eval <<endl;
         // First improvement
         if ((local_best_eval - aux_eval) > 0.00001){
           local_best_eval = aux_eval;
           best_n = i;
           improvement = true;
           if (verbose)
             cout << "     improvement " << aux_eval << endl ;
           
           
           // Add a tabu movement since we found improvement
           tabu.first = a_list[i].first;
           tabu.second = -1*a_list[i].second;
           
           // If first improvement has been chosen break and 
           if (!best_improvement) { 
             if (i==(a_list.size()-1)) completed = true;
             break;
           }
         }
         
         // Undo movement to continue the search
         diff = (*s)->undoLast();
         if (diff.size()>0)
           aux_eval = P.incremental_eval(*(*s), diff);
         
         if (i == (a_list.size()-1)) completed = true;
         
         time_end = clock();
         used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
         if (max_time!=0 && used_time >= max_time) {
           break;
         }
       } 
      
       //Apply best neighbor
       if (improvement && best_improvement) {
         if (a_list[best_n].second < 0 ){
           diff = (*s)->modifyIntensityAperture(abs(a_list[best_n].second)-1, -step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         } else {
           diff = (*s)->modifyIntensityAperture(a_list[best_n].second-1, step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         }
       }
       
       time_end = clock();
       used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
       if (max_time!=0 && used_time >= max_time) {
         break;
       }
    }
    
    cout << "  iLS best: " << local_best_eval ;
    if (!completed) cout << ": [nolo] : ";
    else  cout << ": [lo] : ";
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << max_time << " :" << used_time << endl;
    return(local_best_eval);
}